

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,basic_string_view<char> value)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *extraout_RDX;
  char *pcVar5;
  counting_iterator<char> *it;
  _Distance __n;
  char *data;
  iterator iVar6;
  str_writer<char> local_28;
  
  uVar4 = value.size_;
  if (this->specs_ == (format_specs *)0x0) {
    pcVar5 = &(this->writer_).out_.blackhole_;
    uVar3 = 0;
    if (0 < (long)uVar4) {
      uVar3 = uVar4;
      pcVar5 = value.data_ + (uVar4 - 1);
    }
    cVar1 = *pcVar5;
    (this->writer_).out_.count_ = (this->writer_).out_.count_ + uVar3;
    (this->writer_).out_.blackhole_ = cVar1;
  }
  else {
    cVar1 = (this->specs_->super_core_format_specs).type;
    if ((cVar1 != '\0') && (cVar1 != 's')) {
      error_handler::on_error((error_handler *)&local_28,"invalid type specifier");
    }
    uVar2 = (this->specs_->super_core_format_specs).precision;
    local_28.size_ = (ulong)uVar2;
    if (uVar4 <= uVar2) {
      local_28.size_ = uVar4;
    }
    if ((int)uVar2 < 0) {
      local_28.size_ = uVar4;
    }
    local_28.s = value.data_;
    basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                *)this,&this->specs_->super_align_spec,&local_28);
    pcVar5 = extraout_RDX;
  }
  iVar6._9_7_ = (undefined7)((ulong)pcVar5 >> 8);
  iVar6.blackhole_ = (this->writer_).out_.blackhole_;
  iVar6.count_ = (this->writer_).out_.count_;
  return iVar6;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }